

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O1

void __thiscall
chrono::ChContactContainerNSC::IntToDescriptor
          (ChContactContainerNSC *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  int iVar1;
  _List_node_base *p_Var2;
  
  iVar1 = 0;
  for (p_Var2 = (this->contactlist_6_6).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_6_6; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_6_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_6_3; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_3_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_3_3; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_333_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_333_3; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_333_6).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_333_6; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_333_333).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_333_333; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_666_3).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_666_3; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_666_6).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_666_6; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_666_333).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_666_333; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  for (p_Var2 = (this->contactlist_666_666).
                super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->contactlist_666_666; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,off_L + iVar1,L,Qc);
    iVar1 = iVar1 + 3;
  }
  p_Var2 = (this->contactlist_6_6_rolling).
           super__List_base<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->contactlist_6_6_rolling) {
    iVar1 = iVar1 + off_L;
    do {
      (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x50))(p_Var2[1]._M_next,iVar1,L,Qc);
      p_Var2 = p_Var2->_M_next;
      iVar1 = iVar1 + 6;
    } while (p_Var2 != (_List_node_base *)&this->contactlist_6_6_rolling);
  }
  return;
}

Assistant:

void ChContactContainerNSC::IntToDescriptor(const unsigned int off_v,
                                            const ChStateDelta& v,
                                            const ChVectorDynamic<>& R,
                                            const unsigned int off_L,
                                            const ChVectorDynamic<>& L,
                                            const ChVectorDynamic<>& Qc) {
    unsigned int coffset = 0;
    _IntToDescriptor(coffset, contactlist_6_6, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_6_3, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_3_3, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_333_3, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_333_6, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_333_333, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_666_3, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_666_6, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_666_333, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_666_666, off_v, v, R, off_L, L, Qc, 3);
    _IntToDescriptor(coffset, contactlist_6_6_rolling, off_v, v, R, off_L, L, Qc, 6);
}